

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O2

Font __thiscall lunasvg::SVGLayoutState::font(SVGLayoutState *this)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  size_type __n;
  string_view *psVar5;
  long in_RSI;
  undefined8 extraout_XMM0_Qa;
  Font FVar6;
  undefined1 local_70 [8];
  FontFace face;
  basic_string_view<char,_std::char_traits<char>_> family;
  string_view input;
  
  cVar1 = *(char *)(in_RSI + 0xbc);
  face.m_face = (plutovg_font_face_t *)0x0;
  input._M_str = *(char **)(in_RSI + 0x168);
  input._M_len = *(size_t *)(in_RSI + 0x170);
  while (input._M_len != 0) {
    if (face.m_face != (plutovg_font_face_t *)0x0) goto LAB_001153d0;
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&input,',',0);
    family = std::basic_string_view<char,_std::char_traits<char>_>::substr(&input,0,__n);
    input._M_str = input._M_str + family._M_len;
    input._M_len = input._M_len - family._M_len;
    if ((input._M_len != 0) && (*input._M_str == ',')) {
      input._M_str = input._M_str + 1;
      input._M_len = input._M_len - 1;
    }
    stripLeadingAndTrailingSpaces(&family);
    sVar3 = family._M_len;
    if (family._M_len != 0) {
      pcVar4 = family._M_str;
      cVar2 = *family._M_str;
      if ((cVar2 == '\'') || (cVar2 == '\"')) {
        family._M_str = family._M_str + 1;
        family._M_len = family._M_len - 1;
        if ((family._M_len != 0) && (pcVar4[sVar3 - 1] == cVar2)) {
          family._M_len = sVar3 - 2;
        }
        stripLeadingAndTrailingSpaces(&family);
      }
    }
    psVar5 = (string_view *)fontFaceCache();
    FontFaceCache::getFontFace((FontFaceCache *)local_70,psVar5,SUB81(&family,0),cVar1 == '\x01');
    FontFace::operator=(&face,(FontFace *)local_70);
    FontFace::~FontFace((FontFace *)local_70);
  }
  if (face.m_face == (plutovg_font_face_t *)0x0) {
    psVar5 = (string_view *)fontFaceCache();
    family._M_str = emptyString_abi_cxx11_;
    family._M_len = DAT_00157368;
    FontFaceCache::getFontFace((FontFaceCache *)local_70,psVar5,SUB81(&family,0),cVar1 == '\x01');
    FontFace::operator=(&face,(FontFace *)local_70);
    FontFace::~FontFace((FontFace *)local_70);
  }
LAB_001153d0:
  Font::Font((Font *)this,&face,*(float *)(in_RSI + 0x7c));
  FontFace::~FontFace(&face);
  FVar6._8_8_ = extraout_XMM0_Qa;
  FVar6.m_face.m_face = (plutovg_font_face_t *)this;
  return FVar6;
}

Assistant:

Font SVGLayoutState::font() const
{
    auto bold = m_font_weight == FontWeight::Bold;
    auto italic = m_font_style == FontStyle::Italic;

    FontFace face;
    std::string_view input(m_font_family);
    while(!input.empty() && face.isNull()) {
        auto family = input.substr(0, input.find(','));
        input.remove_prefix(family.length());
        if(!input.empty() && input.front() == ',')
            input.remove_prefix(1);
        stripLeadingAndTrailingSpaces(family);
        if(!family.empty() && (family.front() == '\'' || family.front() == '"')) {
            auto quote = family.front();
            family.remove_prefix(1);
            if(!family.empty() && family.back() == quote)
                family.remove_suffix(1);
            stripLeadingAndTrailingSpaces(family);
        }

        face = fontFaceCache()->getFontFace(family, bold, italic);
    }

    if(face.isNull())
        face = fontFaceCache()->getFontFace(emptyString, bold, italic);
    return Font(face, m_font_size);
}